

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collide_device.cpp
# Opt level: O0

uint embree::createTriangulatedSphere(RTCScene scene,Vec3fa *p,float r)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 *puVar6;
  pointer pMVar7;
  reference pvVar8;
  reference pvVar9;
  undefined8 uVar10;
  size_type sVar11;
  int iVar12;
  int iVar13;
  float *in_RSI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [16];
  uint geomID;
  RTCGeometry geom;
  int theta_3;
  int p11;
  int p10;
  int p01;
  int p00;
  int theta_2;
  int phi_1;
  int theta_1;
  value_type *v;
  float thetaf;
  int theta;
  float cosp;
  float sinp;
  float phif;
  int phi;
  float rcpNumPhi;
  float rcpNumTheta;
  int tri;
  unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> sphere;
  __m128 r_2;
  __m128 a_1;
  __m128 r_1;
  __m128 a;
  pointer in_stack_fffffffffffffcb8;
  undefined4 in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc4;
  undefined4 in_stack_fffffffffffffcd0;
  uint uVar21;
  size_type in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  int local_280;
  int local_26c;
  int local_268;
  int local_264;
  int local_254;
  int local_244;
  int local_238;
  float local_98;
  float local_58;
  
  puVar6 = (undefined8 *)::operator_new(0x38);
  puVar6[4] = 0;
  puVar6[5] = 0;
  puVar6[2] = 0;
  puVar6[3] = 0;
  *puVar6 = 0;
  puVar6[1] = 0;
  puVar6[6] = 0;
  collide2::Mesh::Mesh((Mesh *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0));
  std::unique_ptr<embree::collide2::Mesh,std::default_delete<embree::collide2::Mesh>>::
  unique_ptr<std::default_delete<embree::collide2::Mesh>,void>
            ((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),in_stack_fffffffffffffcb8
            );
  std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::operator->
            ((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             0x13fd4a);
  std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::resize
            ((vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),in_stack_fffffffffffffcd8
            );
  std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::operator->
            ((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             0x13fd82);
  std::vector<Triangle,_std::allocator<Triangle>_>::resize
            ((vector<Triangle,_std::allocator<Triangle>_> *)
             CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),in_stack_fffffffffffffcd8
            );
  local_238 = 0;
  fVar14 = (float)numTheta;
  auVar20 = rcpss(ZEXT416((uint)fVar14),ZEXT416((uint)fVar14));
  local_98 = auVar20._0_4_;
  fVar15 = (float)numPhi;
  auVar20 = rcpss(ZEXT416((uint)fVar15),ZEXT416((uint)fVar15));
  local_58 = auVar20._0_4_;
  fVar16 = *in_RSI;
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x1400bd);
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[](&pMVar7->x_,0);
  (pvVar8->field_0).m128[0] = fVar16;
  fVar16 = in_RSI[1];
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x140106);
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[](&pMVar7->x_,0);
  (pvVar8->field_0).m128[1] = fVar16 + in_XMM0_Da;
  fVar16 = in_RSI[2];
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x140147);
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[](&pMVar7->x_,0);
  (pvVar8->field_0).m128[2] = fVar16;
  for (local_244 = 0; local_244 < numPhi + -1; local_244 = local_244 + 1) {
    fVar16 = (float)(local_244 + 1) * 3.1415927 * local_58 * (2.0 - local_58 * fVar15);
    fVar17 = sinf(fVar16);
    fVar16 = cosf(fVar16);
    for (local_254 = 0; local_254 < numTheta; local_254 = local_254 + 1) {
      fVar18 = (float)local_254 * 2.0 * 3.1415927 * local_98 * (2.0 - local_98 * fVar14);
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x1402d0);
      pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                         (&pMVar7->x_,(long)(local_244 * numTheta + local_254 + 1));
      fVar1 = *in_RSI;
      fVar19 = sinf(fVar18);
      (pvVar8->field_0).m128[0] = in_XMM0_Da * fVar17 * fVar19 + fVar1;
      (pvVar8->field_0).m128[1] = in_XMM0_Da * fVar16 + in_RSI[1];
      fVar1 = in_RSI[2];
      fVar18 = cosf(fVar18);
      (pvVar8->field_0).m128[2] = in_XMM0_Da * fVar17 * fVar18 + fVar1;
    }
  }
  fVar16 = *in_RSI;
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x14049d);
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                     (&pMVar7->x_,(long)(numTheta * (numPhi + -1) + 1));
  (pvVar8->field_0).m128[0] = fVar16;
  fVar16 = in_RSI[1];
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x1404fa);
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                     (&pMVar7->x_,(long)(numTheta * (numPhi + -1) + 1));
  (pvVar8->field_0).m128[1] = fVar16 - in_XMM0_Da;
  fVar16 = in_RSI[2];
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x14054f);
  pvVar8 = std::vector<embree::Vec3fa,_std::allocator<embree::Vec3fa>_>::operator[]
                     (&pMVar7->x_,(long)(numTheta * (numPhi + -1) + 1));
  (pvVar8->field_0).m128[2] = fVar16;
  for (local_264 = 0; local_264 < numTheta; local_264 = local_264 + 1) {
    pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                         *)0x1405c0);
    pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                       (&pMVar7->tris_,(long)local_238);
    pvVar9->v0 = local_264 + 1;
    pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                         *)0x1405e7);
    pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                       (&pMVar7->tris_,(long)local_238);
    pvVar9->v1 = 0;
    iVar12 = (local_264 + 1) % numTheta;
    pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                         *)0x14062a);
    pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                       (&pMVar7->tris_,(long)local_264);
    pvVar9->v2 = iVar12 + 1;
    local_238 = local_238 + 1;
  }
  for (local_268 = 0; local_268 < numPhi + -2; local_268 = local_268 + 1) {
    for (local_26c = 0; local_26c < numTheta; local_26c = local_26c + 1) {
      iVar12 = local_268 * numTheta;
      iVar2 = local_268 * numTheta + 1 + (local_26c + 1) % numTheta;
      iVar3 = (local_268 + 1) * numTheta + 1 + local_26c;
      iVar4 = (local_268 + 1) * numTheta;
      iVar13 = (local_26c + 1) % numTheta;
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x140787);
      pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&pMVar7->tris_,(long)local_238);
      pvVar9->v0 = iVar3;
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x1407b9);
      pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&pMVar7->tris_,(long)local_238);
      pvVar9->v1 = iVar2;
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x1407ec);
      pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&pMVar7->tris_,(long)local_238);
      pvVar9->v2 = iVar12 + 1 + local_26c;
      iVar12 = local_238 + 1;
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x140830);
      pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&pMVar7->tris_,(long)iVar12);
      pvVar9->v0 = iVar4 + 1 + iVar13;
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x140862);
      pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&pMVar7->tris_,(long)iVar12);
      pvVar9->v1 = iVar2;
      pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
               ::operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                             *)0x140895);
      pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                         (&pMVar7->tris_,(long)iVar12);
      pvVar9->v2 = iVar3;
      local_238 = local_238 + 2;
    }
  }
  for (local_280 = 0; local_280 < numTheta; local_280 = local_280 + 1) {
    iVar12 = (local_280 + 1) % numTheta + numTheta * (numPhi + -2) + 1;
    pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                         *)0x140954);
    pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                       (&pMVar7->tris_,(long)local_238);
    pvVar9->v0 = iVar12;
    iVar12 = numTheta * (numPhi + -1);
    pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                         *)0x14099a);
    pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                       (&pMVar7->tris_,(long)local_238);
    pvVar9->v1 = iVar12 + 1;
    iVar12 = numTheta * (numPhi + -2);
    pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
             operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                         *)0x1409ea);
    pvVar9 = std::vector<Triangle,_std::allocator<Triangle>_>::operator[]
                       (&pMVar7->tris_,(long)local_238);
    pvVar9->v2 = local_280 + iVar12 + 1;
    local_238 = local_238 + 1;
  }
  uVar10 = rtcNewGeometry(g_device,0x78);
  uVar5 = rtcAttachGeometry(in_RDI,uVar10);
  uVar21 = uVar5;
  pMVar7 = std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::
           operator->((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>
                       *)0x140a94);
  sVar11 = std::vector<Triangle,_std::allocator<Triangle>_>::size(&pMVar7->tris_);
  rtcSetGeometryUserPrimitiveCount(uVar10,sVar11 & 0xffffffff);
  rtcSetGeometryUserData(uVar10,uVar5);
  rtcSetGeometryBoundsFunction(uVar10,triangle_bounds_func,0);
  rtcSetGeometryIntersectFunction(uVar10,triangle_intersect_func);
  rtcCommitGeometry(uVar10);
  rtcReleaseGeometry(uVar10);
  std::
  vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
  ::push_back((vector<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>,_std::allocator<std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>_>_>
               *)CONCAT44(in_stack_fffffffffffffcc4,in_stack_fffffffffffffcc0),
              (value_type *)in_stack_fffffffffffffcb8);
  std::unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_>::~unique_ptr
            ((unique_ptr<embree::collide2::Mesh,_std::default_delete<embree::collide2::Mesh>_> *)
             CONCAT44(uVar21,in_stack_fffffffffffffcd0));
  return uVar5;
}

Assistant:

unsigned int createTriangulatedSphere (RTCScene scene, const Vec3fa& p, float r)
{
  /* create triangle mesh */
  std::unique_ptr<collide2::Mesh> sphere (new collide2::Mesh());
  sphere->x_.resize (numTheta*(numPhi-1)+2);
  sphere->tris_.resize (2*numTheta*(numPhi-1));

  /* create sphere */
  int tri = 0;
  const float rcpNumTheta = rcp((float)numTheta);
  const float rcpNumPhi   = rcp((float)numPhi);
  sphere->x_[0].x = p.x;
  sphere->x_[0].y = p.y + r;
  sphere->x_[0].z = p.z;

  for (int phi=0; phi<numPhi-1; phi++)
  {
    const float phif   = (phi+1)*float(pi)*rcpNumPhi;
    const float sinp   = sin(phif);
    const float cosp   = cos(phif);
    for (int theta=0; theta<numTheta; theta++)
    {
      const float thetaf = theta*2.0f*float(pi)*rcpNumTheta;

      auto& v = sphere->x_[phi*(numTheta)+theta+1];
      v.x = p.x + r*sinp*sin(thetaf);
      v.y = p.y + r*cosp;
      v.z = p.z + r*sinp*cos(thetaf);
    }
  }
  sphere->x_[numTheta*(numPhi-1)+1].x = p.x;
  sphere->x_[numTheta*(numPhi-1)+1].y = p.y - r;
  sphere->x_[numTheta*(numPhi-1)+1].z = p.z;

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = theta+1;
    sphere->tris_[tri].v1 = 0;
    sphere->tris_[theta].v2 = (theta+1)%numTheta + 1;
    tri++;
  }

  for (int phi=0; phi<numPhi-2; phi++)
  {
    for (int theta=0; theta<numTheta; theta++)
    {
      int p00 = phi*numTheta + 1 + theta;
      int p01 = phi*numTheta + 1 + (theta+1)%numTheta;
      int p10 = (phi+1)*numTheta + 1 + theta;
      int p11 = (phi+1)*numTheta + 1 + (theta+1)%numTheta;

      sphere->tris_[tri].v0 = p10;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p00;
      tri++;

      sphere->tris_[tri].v0 = p11;
      sphere->tris_[tri].v1 = p01;
      sphere->tris_[tri].v2 = p10;
      tri++;
    }
  }

  for (int theta=0; theta<numTheta; theta++) {
    sphere->tris_[tri].v0 = (theta+1)%numTheta + numTheta*(numPhi-2) + 1;
    sphere->tris_[tri].v1 = numTheta*(numPhi-1)+1;
    sphere->tris_[tri].v2 = theta + numTheta*(numPhi-2) + 1;
    tri++;
  }

  // if (use_user_geometry) {
    RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_USER);
    unsigned int geomID = rtcAttachGeometry(scene,geom);
    rtcSetGeometryUserPrimitiveCount(geom, sphere->tris_.size());
    rtcSetGeometryUserData(geom,(void*)(size_t)geomID);
    rtcSetGeometryBoundsFunction   (geom, triangle_bounds_func, nullptr);
    rtcSetGeometryIntersectFunction(geom, triangle_intersect_func);
    rtcCommitGeometry(geom);
    rtcReleaseGeometry(geom);
    meshes.push_back (std::move (sphere));
    return geomID;
  // } else {
  //   RTCGeometry geom = rtcNewGeometry (g_device, RTC_GEOMETRY_TYPE_TRIANGLE);
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_VERTEX,0,RTC_FORMAT_FLOAT3,sphere->x_.data(),0,sizeof(collide2::vec_t),sphere->x_.size());
  //   rtcSetSharedGeometryBuffer(geom,RTC_BUFFER_TYPE_INDEX,0,RTC_FORMAT_UINT3,sphere->tris_.data(),0,sizeof(Triangle),sphere->tris_.size ());
  //   rtcCommitGeometry(geom);
  //   unsigned int geomID = rtcAttachGeometry(scene,geom);
  //   rtcReleaseGeometry(geom);
  //   meshes.push_back (std::move (sphere));
  //   return geomID;
  // }
}